

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O0

void __thiscall libcalc::Tokenizer::parse(Tokenizer *this,string *expression)

{
  char symbol;
  bool bVar1;
  Token *pTVar2;
  reference pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char e;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  Token *local_20;
  Token *t;
  string *expression_local;
  Tokenizer *this_local;
  
  t = (Token *)expression;
  expression_local = (string *)this;
  pTVar2 = (Token *)operator_new(0x28);
  Token::Token(pTVar2);
  local_20 = pTVar2;
  std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
            (&this->tokens,&local_20);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    symbol = *pcVar3;
    bVar1 = Token::push(local_20,symbol);
    if (!bVar1) {
      pTVar2 = (Token *)operator_new(0x28);
      Token::Token(pTVar2,symbol);
      local_20 = pTVar2;
      std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::push_back
                (&this->tokens,&local_20);
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Tokenizer::parse(std::string expression) {
  Token *t = new Token();
  tokens.push_back(t);

  for (char e : expression) {
    if (!t->push(e)) {
      t = new Token(e);
      tokens.push_back(t);
    }
  }
}